

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpart.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  size_t partlen;
  char *part;
  ulong local_20;
  char *local_18;
  
  if (argc < 3) {
    iVar1 = 0;
    curl_mprintf("./testpart main sub\n");
  }
  else {
    iVar1 = getpart(&local_18,&local_20,argv[1],argv[2],_stdin);
    if (iVar1 == 0) {
      if (local_20 != 0) {
        uVar2 = 0;
        do {
          curl_mprintf("%c",(ulong)(uint)(int)local_18[uVar2]);
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_20);
      }
      free(local_18);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
  int rc;
  char  *part;
  size_t partlen, i;

  if(argc< 3) {
    printf("./testpart main sub\n");
  }
  else {
    rc = getpart(&part, &partlen, argv[1], argv[2], stdin);
    if(rc)
      return rc;
    for(i = 0; i < partlen; i++)
      printf("%c", part[i]);
    free(part);
  }
  return 0;
}